

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O1

size_t __thiscall flow::ConstantPool::makeNativeHandler(ConstantPool *this,string *sig)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  size_type *psVar5;
  size_t sVar6;
  bool bVar7;
  
  pbVar1 = (this->nativeHandlerSignatures_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->nativeHandlerSignatures_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar4 != 0) {
    __s2 = (sig->_M_dataplus)._M_p;
    sVar2 = sig->_M_string_length;
    psVar5 = &pbVar1->_M_string_length;
    bVar7 = false;
    sVar6 = 0;
    do {
      __n = *psVar5;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar5 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        if (!bVar7) {
          return sVar6;
        }
        break;
      }
      sVar6 = sVar6 + 1;
      psVar5 = psVar5 + 4;
      bVar7 = lVar4 >> 5 == sVar6;
    } while (!bVar7);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->nativeHandlerSignatures_,sig);
  return ((long)(this->nativeHandlerSignatures_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->nativeHandlerSignatures_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
}

Assistant:

size_t ConstantPool::makeNativeHandler(const std::string& sig) {
  return ensureValue(nativeHandlerSignatures_, sig);
}